

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3acc_io.c
# Opt level: O1

int rdacc_mmie_den(char *dir,char *lat_name,vector_t ****inout_wt_mean,vector_t ****inout_wt_var,
                  float32 ****inout_dnom,uint32 *inout_n_mgau,uint32 *inout_n_stream,
                  uint32 *inout_n_density,uint32 **inout_veclen)

{
  uint32 uVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint32 n_stream;
  uint32 n_density;
  uint32 n_mgau;
  uint32 *in_veclen;
  vector_t ***in_wt_var;
  vector_t ***in_wt_mean;
  float32 ***in_dnom;
  int32 pass2var;
  char fn [4097];
  uint32 *out_n_feat;
  uint32 local_1084;
  uint32 local_1080;
  uint local_107c;
  uint32 *local_1078;
  vector_t ***local_1070;
  vector_t ***local_1068;
  vector_t ***local_1060;
  float32 ***local_1058;
  float32 ***local_1050;
  vector_t ***local_1048;
  int32 local_103c;
  char local_1038 [4104];
  
  sprintf(local_1038,"%s/%s_gauden_counts",dir,lat_name);
  out_n_feat = &local_1084;
  iVar2 = s3gaucnt_read(local_1038,&local_1068,&local_1070,&local_103c,&local_1058,&local_107c,
                        out_n_feat,&local_1080,&local_1078);
  if (iVar2 == 0) {
    local_1048 = *inout_wt_mean;
    local_1060 = *inout_wt_var;
    if (local_1048 == (vector_t ***)0x0) {
      *inout_wt_mean = local_1068;
      *inout_dnom = local_1058;
      *inout_n_mgau = local_107c;
      *inout_n_stream = local_1084;
      *inout_n_density = local_1080;
      *inout_veclen = local_1078;
      iVar2 = 0;
      if (local_1070 != (vector_t ***)0x0 && local_1060 == (vector_t ***)0x0) {
        *inout_wt_var = local_1070;
      }
    }
    else {
      local_1050 = *inout_dnom;
      uVar1 = *inout_n_mgau;
      bVar4 = uVar1 != local_107c;
      if (bVar4) {
        out_n_feat = (uint32 *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar1);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x1eb,"# mix. Gau. for file %s (== %u) != prior # mix. Gau. (== %u)\n",local_1038,
                (ulong)local_107c,out_n_feat);
      }
      uVar1 = *inout_n_stream;
      bVar5 = uVar1 != local_1084;
      if (bVar5) {
        out_n_feat = (uint32 *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar1);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x1f2,"# stream for file %s (== %u) != prior # stream (== %u)\n",local_1038,
                (ulong)local_1084,out_n_feat);
      }
      uVar1 = *inout_n_density;
      bVar6 = uVar1 != local_1080;
      if (bVar6) {
        out_n_feat = (uint32 *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar1);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x1f9,"# density comp/mix for file %s (== %u) != prior # density, %u\n",local_1038,
                (ulong)local_1080,out_n_feat);
      }
      bVar6 = bVar6 || (bVar5 || bVar4);
      if (local_1084 != 0) {
        uVar3 = 0;
        do {
          if ((*inout_veclen)[uVar3] != local_1078[uVar3]) {
            out_n_feat = (uint32 *)CONCAT44((int)((ulong)out_n_feat >> 0x20),(*inout_veclen)[uVar3])
            ;
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                    ,0x201,"vector length of stream %u (== %u) != prior length (== %u)\n",
                    uVar3 & 0xffffffff,(ulong)local_1078[uVar3],out_n_feat);
            bVar6 = true;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < local_1084);
      }
      ckd_free(local_1078);
      iVar2 = -1;
      if (!bVar6) {
        accum_3d(local_1050,local_1058,local_107c,local_1084,local_1080);
        gauden_accum_param(local_1048,local_1068,local_107c,local_1084,local_1080,*inout_veclen);
        gauden_free_param(local_1068);
        iVar2 = 0;
        if (local_1060 != (vector_t ***)0x0) {
          if (local_1070 == (vector_t ***)0x0) {
            __assert_fail("in_wt_var",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                          ,0x213,
                          "int rdacc_mmie_den(const char *, const char *, vector_t ****, vector_t ****, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                         );
          }
          gauden_accum_param(local_1060,local_1070,local_107c,local_1084,local_1080,*inout_veclen);
          gauden_free_param(local_1070);
          iVar2 = 0;
        }
      }
    }
  }
  else {
    rdacc_mmie_den_cold_1();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
rdacc_mmie_den(const char *dir,
               const char *lat_name,
               vector_t **** inout_wt_mean,
               vector_t **** inout_wt_var,
               float32 **** inout_dnom,
               uint32 * inout_n_mgau,
               uint32 * inout_n_stream,
               uint32 * inout_n_density, uint32 ** inout_veclen)
{
    char fn[MAXPATHLEN + 1];
    vector_t ***in_wt_mean;
    vector_t ***wt_mean;
    vector_t ***in_wt_var;
    vector_t ***wt_var;
    float32 ***in_dnom;
    float32 ***dnom;
    uint32 n_mgau;
    uint32 n_density;
    uint32 n_stream;
    uint32 *in_veclen;
    int32 pass2var;
    int i;

    sprintf(fn, "%s/%s_gauden_counts", dir, lat_name);

    if (s3gaucnt_read(fn,
                      &in_wt_mean,
                      &in_wt_var,
                      &pass2var,
                      &in_dnom,
                      &n_mgau,
                      &n_stream, &n_density, &in_veclen) != S3_SUCCESS) {
        fflush(stdout);
        perror(fn);

        return S3_ERROR;
    }

    wt_mean = *inout_wt_mean;
    wt_var = *inout_wt_var;
    dnom = *inout_dnom;

    if (wt_mean == NULL) {

        /* if a gauden_counts file exists, it will have reestimated means */

        *inout_wt_mean = wt_mean = in_wt_mean;
        *inout_dnom = dnom = in_dnom;
        *inout_n_mgau = n_mgau;
        *inout_n_stream = n_stream;
        *inout_n_density = n_density;
        *inout_veclen = in_veclen;

        if (wt_var == NULL && in_wt_var != NULL) {
            *inout_wt_var = wt_var = in_wt_var;
        }
    }
    else {
        int err = FALSE;

        /* check if matrices are able to be added */
        if (*inout_n_mgau != n_mgau) {
            E_ERROR
                ("# mix. Gau. for file %s (== %u) != prior # mix. Gau. (== %u)\n",
                 fn, n_mgau, *inout_n_mgau);
            err = TRUE;
        }

        if (*inout_n_stream != n_stream) {
            E_ERROR
                ("# stream for file %s (== %u) != prior # stream (== %u)\n",
                 fn, n_stream, *inout_n_stream);
            err = TRUE;
        }

        if (*inout_n_density != n_density) {
            E_ERROR
                ("# density comp/mix for file %s (== %u) != prior # density, %u\n",
                 fn, n_density, *inout_n_density);
            err = TRUE;
        }

        for (i = 0; i < n_stream; i++) {
            if ((*inout_veclen)[i] != in_veclen[i]) {
                E_ERROR
                    ("vector length of stream %u (== %u) != prior length (== %u)\n",
                     i, in_veclen[i], (*inout_veclen)[i]);
                err = TRUE;
            }
        }

        ckd_free((void *) in_veclen);

        if (err)
            return S3_ERROR;

        /* accumulate values */
        accum_3d(dnom, in_dnom, n_mgau, n_stream, n_density);

        gauden_accum_param(wt_mean, in_wt_mean,
                           n_mgau, n_stream, n_density, *inout_veclen);
        gauden_free_param(in_wt_mean);

        if (wt_var) {
            assert(in_wt_var);

            gauden_accum_param(wt_var, in_wt_var,
                               n_mgau, n_stream, n_density, *inout_veclen);
            gauden_free_param(in_wt_var);
        }
    }

    return S3_SUCCESS;
}